

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O2

void fmt::report_system_error(int error_code,StringRef message)

{
  size_t in_R8;
  StringRef message_00;
  MemoryWriter full_message;
  
  full_message.super_BasicWriter<char>.buffer_ = &full_message.buffer_.super_Buffer<char>;
  full_message.super_BasicWriter<char>._vptr_BasicWriter =
       (_func_int **)&PTR__BasicMemoryWriter_0018a978;
  full_message.buffer_.super_Buffer<char>.ptr_ = full_message.buffer_.data_;
  full_message.buffer_.super_Buffer<char>.size_ = 0;
  full_message.buffer_.super_Buffer<char>.capacity_ = 500;
  full_message.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_0018a9c0;
  message_00.size_ = in_R8;
  message_00.data_ = (char *)message.size_;
  internal::format_system_error
            ((internal *)&full_message,(Writer *)(ulong)(uint)error_code,(int)message.data_,
             message_00);
  fwrite((full_message.super_BasicWriter<char>.buffer_)->ptr_,
         (full_message.super_BasicWriter<char>.buffer_)->size_,1,_stderr);
  fputc(10,_stderr);
  BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(&full_message);
  return;
}

Assistant:

FMT_FUNC void fmt::report_system_error(
    int error_code, fmt::StringRef message) FMT_NOEXCEPT {
  // 'fmt::' is for bcc32.
  fmt::report_error(internal::format_system_error, error_code, message);
}